

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O3

double __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::spf1
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,int subtreeRootNode1,TreeIndexAPTED *t2,int subtreeRootNode2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar4 = (long)subtreeRootNode1;
  iVar1 = (t1->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[lVar4];
  lVar3 = (long)subtreeRootNode2;
  iVar2 = (t2->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[lVar3];
  if (iVar2 == 1 && iVar1 == 1) {
    dVar6 = 0.0;
    if ((t1->super_PreLToLabelId).prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar4] !=
        (t2->super_PreLToLabelId).prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar3]) {
      dVar6 = 1.0;
    }
  }
  else {
    if (iVar1 == 1) {
      dVar5 = (t2->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar3];
      dVar7 = dVar5 + 1.0;
      dVar8 = dVar5;
      if (0 < iVar2) {
        dVar6 = dVar5;
        do {
          dVar8 = -1.0;
          if ((t1->super_PreLToLabelId).prel_to_label_id_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar4] !=
              (t2->super_PreLToLabelId).prel_to_label_id_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar3]) {
            dVar8 = 0.0;
          }
          if (dVar6 <= dVar8) {
            dVar8 = dVar6;
          }
          lVar3 = lVar3 + 1;
          dVar6 = dVar8;
        } while (lVar3 < iVar2 + subtreeRootNode2);
      }
    }
    else {
      if (iVar2 != 1) {
        return -1.0;
      }
      dVar5 = (t1->super_PreLToSubtreeCost).prel_to_subtree_del_cost_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar4];
      dVar7 = dVar5 + 1.0;
      dVar8 = dVar5;
      if (0 < iVar1) {
        dVar6 = dVar5;
        do {
          dVar8 = -1.0;
          if ((t1->super_PreLToLabelId).prel_to_label_id_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar4] !=
              (t2->super_PreLToLabelId).prel_to_label_id_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar3]) {
            dVar8 = 0.0;
          }
          if (dVar6 <= dVar8) {
            dVar8 = dVar6;
          }
          lVar4 = lVar4 + 1;
          dVar6 = dVar8;
        } while (lVar4 < iVar1 + subtreeRootNode1);
      }
    }
    dVar6 = dVar5 + dVar8;
    if (dVar7 <= dVar5 + dVar8) {
      dVar6 = dVar7;
    }
  }
  return dVar6;
}

Assistant:

double APTEDTreeIndex<CostModel, TreeIndex>::spf1(const TreeIndex& t1,
    int subtreeRootNode1, const TreeIndex& t2, int subtreeRootNode2) {
  int subtreeSize1 = t1.prel_to_size_[subtreeRootNode1];
  int subtreeSize2 = t2.prel_to_size_[subtreeRootNode2];
  if (subtreeSize1 == 1 && subtreeSize2 == 1) {
    int label1 = t1.prel_to_label_id_[subtreeRootNode1];
    int label2 = t2.prel_to_label_id_[subtreeRootNode2];
    double maxCost = c_.del(label1) + c_.ins(label2);
    double renCost = c_.ren(label1, label2);
    // std::cout << "spf1 = " << (renCost < maxCost ? renCost : maxCost) << std::endl;
    return renCost < maxCost ? renCost : maxCost;
  }
  if (subtreeSize1 == 1) {
    int label1 = t1.prel_to_label_id_[subtreeRootNode1];
    double cost = t2.prel_to_subtree_ins_cost_[subtreeRootNode2];
    double maxCost = cost + c_.del(label1);
    double minRenMinusIns = cost;
    double nodeRenMinusIns = 0;
    for (int i = subtreeRootNode2; i < subtreeRootNode2 + subtreeSize2; ++i) {
      int label2 = t2.prel_to_label_id_[i];
      nodeRenMinusIns = c_.ren(label1, label2) - c_.ins(label2);
      if (nodeRenMinusIns < minRenMinusIns) {
        minRenMinusIns = nodeRenMinusIns;
      }
    }
    cost += minRenMinusIns;
    // std::cout << "spf1 = " << (cost < maxCost ? cost : maxCost) << std::endl;
    return cost < maxCost ? cost : maxCost;
  }
  if (subtreeSize2 == 1) {
    int label2 = t2.prel_to_label_id_[subtreeRootNode2];
    double cost = t1.prel_to_subtree_del_cost_[subtreeRootNode1];
    double maxCost = cost + c_.ins(label2);
    double minRenMinusDel = cost;
    double nodeRenMinusDel = 0;
    for (int i = subtreeRootNode1; i < subtreeRootNode1 + subtreeSize1; ++i) {
      int label1 = t1.prel_to_label_id_[i];
      nodeRenMinusDel = c_.ren(label1, label2) - c_.del(label1);
      if (nodeRenMinusDel < minRenMinusDel) {
        minRenMinusDel = nodeRenMinusDel;
      }
    }
    cost += minRenMinusDel;
    // std::cout << "spf1 = " << (cost < maxCost ? cost : maxCost) << std::endl;
    return cost < maxCost ? cost : maxCost;
  }
  // std::cout << "spf1 = -1" << std::endl;
  return -1;
}